

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

void __thiscall kj::_::BTreeImpl::erase(BTreeImpl *this,uint row,SearchKey *searchKey)

{
  Exception *pEVar1;
  bool bVar2;
  uint i_00;
  Parent *pPVar3;
  ulong uVar4;
  size_t sVar5;
  Leaf *this_00;
  Fault local_b0;
  Fault f_3;
  Fault f_2;
  Fault f_1;
  uint r;
  Leaf *leaf;
  Fault local_78;
  Fault f;
  MaybeUint *newFixup;
  Parent *node;
  Iterator local_58;
  uint i;
  Iterator __end2;
  Iterator __begin2;
  Range<unsigned_int> *__range2;
  MaybeUint *fixup;
  Parent *pPStack_30;
  uint indexInParent;
  Parent *parent;
  SearchKey *pSStack_20;
  uint pos;
  SearchKey *searchKey_local;
  BTreeImpl *pBStack_10;
  uint row_local;
  BTreeImpl *this_local;
  
  parent._4_4_ = 0;
  pPStack_30 = (Parent *)0x0;
  fixup._4_4_ = 0;
  __range2 = (Range<unsigned_int> *)0x0;
  pSStack_20 = searchKey;
  searchKey_local._4_4_ = row;
  pBStack_10 = this;
  ___end2 = zeroTo<unsigned_int>(this->height);
  i = (uint)Range<unsigned_int>::begin((Range<unsigned_int> *)&__end2);
  local_58 = Range<unsigned_int>::end((Range<unsigned_int> *)&__end2);
  while (bVar2 = Range<unsigned_int>::Iterator::operator!=((Iterator *)&i,&local_58), bVar2) {
    Range<unsigned_int>::Iterator::operator*((Iterator *)&i);
    pPVar3 = eraseHelper<kj::_::BTreeImpl::Parent>
                       (this,(Parent *)(this->tree + parent._4_4_),pPStack_30,fixup._4_4_,
                        parent._4_4_,(MaybeUint **)&__range2);
    pPStack_30 = pPVar3;
    fixup._4_4_ = (**pSStack_20->_vptr_SearchKey)(pSStack_20,pPVar3);
    parent._4_4_ = pPVar3->children[fixup._4_4_];
    uVar4 = (ulong)fixup._4_4_;
    sVar5 = size<kj::_::BTreeImpl::MaybeUint,7ul>(&pPVar3->keys);
    pEVar1 = (Exception *)__range2;
    if ((((uVar4 < sVar5) &&
         (bVar2 = MaybeUint::operator==(pPVar3->keys + fixup._4_4_,searchKey_local._4_4_),
         pEVar1 = (Exception *)__range2, bVar2)) &&
        (f.exception = (Exception *)(pPVar3->keys + fixup._4_4_),
        (Exception *)__range2 != f.exception)) &&
       (pEVar1 = f.exception, __range2 != (Range<unsigned_int> *)0x0)) {
      Debug::Fault::Fault(&local_78,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                          ,0x1f6,FAILED,"fixup == nullptr","");
      Debug::Fault::fatal(&local_78);
    }
    __range2 = (Range<unsigned_int> *)pEVar1;
    Range<unsigned_int>::Iterator::operator++((Iterator *)&i);
  }
  this_00 = eraseHelper<kj::_::BTreeImpl::Leaf>
                      (this,(Leaf *)(this->tree + parent._4_4_),pPStack_30,fixup._4_4_,parent._4_4_,
                       (MaybeUint **)&__range2);
  i_00 = (*pSStack_20->_vptr_SearchKey[1])(pSStack_20,this_00);
  bVar2 = MaybeUint::operator==(this_00->rows + i_00,searchKey_local._4_4_);
  if (bVar2) {
    Leaf::erase(this_00,i_00);
    if (__range2 != (Range<unsigned_int> *)0x0) {
      bVar2 = MaybeUint::operator==(this_00->rows + i_00,(void *)0x0);
      if (!bVar2) {
        Debug::Fault::Fault(&f_2,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                            ,0x205,FAILED,"leaf.rows[r] == nullptr","");
        Debug::Fault::fatal(&f_2);
      }
      if (i_00 == 0) {
        Debug::Fault::Fault(&f_3,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                            ,0x206,FAILED,"r > 0","");
        Debug::Fault::fatal(&f_3);
      }
      bVar2 = MaybeUint::operator==((MaybeUint *)__range2,searchKey_local._4_4_);
      if (!bVar2) {
        Debug::Fault::Fault(&local_b0,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                            ,0x207,FAILED,"*fixup == row","");
        Debug::Fault::fatal(&local_b0);
      }
      __range2->begin_ = this_00->rows[i_00 - 1].i;
    }
  }
  else {
    logInconsistency(this);
  }
  return;
}

Assistant:

void BTreeImpl::erase(uint row, const SearchKey& searchKey) {
  // Erase the given row number from the tree. predicate() returns true for the given row and all
  // rows after it.

  uint pos = 0;

  // Track grandparent node and child index within grandparent.
  Parent* parent = nullptr;
  uint indexInParent = 0;

  MaybeUint* fixup = nullptr;

  for (auto i KJ_UNUSED: zeroTo(height)) {
    Parent& node = eraseHelper(tree[pos].parent, parent, indexInParent, pos, fixup);

    parent = &node;
    indexInParent = searchKey.search(node);
    pos = node.children[indexInParent];

    if (indexInParent < kj::size(node.keys) && node.keys[indexInParent] == row) {
      // Oh look, the row is a key in this node! We'll need to come back and fix this up later.
      // Note that any particular row can only appear as *one* key value anywhere in the tree, so
      // we only need one fixup pointer, which is nice.
      MaybeUint* newFixup = &node.keys[indexInParent];
      if (fixup == newFixup) {
        // The fixup pointer was already set while processing a parent node, and then a merge or
        // rotate caused it to be moved, but the fixup pointer was updated... so it's already set
        // to point at the slot we wanted it to point to, so nothing to see here.
      } else {
        KJ_DASSERT(fixup == nullptr);
        fixup = newFixup;
      }
    }
  }

  Leaf& leaf = eraseHelper(tree[pos].leaf, parent, indexInParent, pos, fixup);

  uint r = searchKey.search(leaf);
  if (leaf.rows[r] == row) {
    leaf.erase(r);

    if (fixup != nullptr) {
      // There's a key in a parent node that needs fixup. This is only possible if the removed
      // node is the last in its leaf.
      KJ_DASSERT(leaf.rows[r] == nullptr);
      KJ_DASSERT(r > 0);  // non-root nodes must be at least half full so this can't be item 0
      KJ_DASSERT(*fixup == row);
      *fixup = leaf.rows[r - 1];
    }
  } else {
    logInconsistency();
  }
}